

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32Ramp.cpp
# Opt level: O0

void __thiscall MT32Emu::LA32Ramp::reset(LA32Ramp *this)

{
  LA32Ramp *this_local;
  
  this->current = 0;
  this->largeTarget = 0;
  this->largeIncrement = 0;
  this->descending = false;
  this->interruptCountdown = 0;
  this->interruptRaised = false;
  return;
}

Assistant:

void LA32Ramp::reset() {
	current = 0;
	largeTarget = 0;
	largeIncrement = 0;
	descending = false;
	interruptCountdown = 0;
	interruptRaised = false;
}